

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

void Sfm_ObjSetupSimInfo(Abc_Obj_t *pObj)

{
  long *plVar1;
  ulong *puVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  int iVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  int Indexes [2] [64];
  uint local_238 [130];
  
  plVar3 = (long *)pObj->pNtk->pData;
  plVar1 = plVar3 + 0x37;
  *(undefined1 (*) [16])(plVar3 + 0x3b) = (undefined1  [16])0x0;
  iVar5 = (int)plVar3[0x13];
  uVar8 = (long)iVar5 * 8;
  iVar11 = (int)uVar8;
  if ((int)plVar3[0x37] < iVar11) {
    sVar12 = (long)iVar5 << 6;
    if ((void *)plVar3[0x38] == (void *)0x0) {
      pvVar6 = malloc(sVar12);
    }
    else {
      pvVar6 = realloc((void *)plVar3[0x38],sVar12);
    }
    plVar3[0x38] = (long)pvVar6;
    if (pvVar6 == (void *)0x0) goto LAB_005296de;
    *(int *)plVar1 = iVar11;
  }
  if (0 < iVar5) {
    memset((void *)plVar3[0x38],0,(uVar8 & 0xffffffff) << 3);
  }
  *(int *)((long)plVar3 + 0x1bc) = iVar11;
  iVar5 = (int)plVar3[0x13];
  uVar8 = (long)iVar5 * 8;
  iVar11 = (int)uVar8;
  if ((int)plVar3[0x39] < iVar11) {
    sVar12 = (long)iVar5 << 6;
    if ((void *)plVar3[0x3a] == (void *)0x0) {
      pvVar6 = malloc(sVar12);
    }
    else {
      pvVar6 = realloc((void *)plVar3[0x3a],sVar12);
    }
    plVar3[0x3a] = (long)pvVar6;
    if (pvVar6 == (void *)0x0) {
LAB_005296de:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    *(int *)(plVar3 + 0x39) = iVar11;
  }
  if (0 < iVar5) {
    memset((void *)plVar3[0x3a],0,(uVar8 & 0xffffffff) << 3);
  }
  *(int *)((long)plVar3 + 0x1cc) = iVar11;
  iVar5 = (((int)*(uint *)(plVar3 + 0x13) >> 4) + 1) - (uint)((*(uint *)(plVar3 + 0x13) & 0xf) == 0)
  ;
  *(int *)(plVar3 + 0x3d) = iVar5;
  if (*(int *)((long)plVar3 + 0x1ec) < iVar5) {
    iVar11 = 0x10;
    if (0x10 < iVar5) {
      iVar11 = iVar5;
    }
    *(int *)((long)plVar3 + 0x1ec) = iVar11;
    lVar15 = 0;
    do {
      sVar12 = (long)*(int *)((long)plVar3 + 0x1ec) << 3;
      if ((void *)plVar3[lVar15 + 0x66] == (void *)0x0) {
        pvVar6 = malloc(sVar12);
      }
      else {
        pvVar6 = realloc((void *)plVar3[lVar15 + 0x66],sVar12);
      }
      plVar3[lVar15 + 0x66] = (long)pvVar6;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 8);
    iVar5 = (int)plVar3[0x3d];
  }
  memset((void *)plVar3[0x66],0,(long)iVar5 << 3);
  if ((*(int *)(*plVar3 + 0x5c) != 0) && (uVar8 = plVar3[0x19], uVar8 != 0)) {
    iVar5 = pObj->Id;
    if (((long)iVar5 < 0) || (iVar11 = *(int *)((long)plVar3 + 0x144), iVar11 <= iVar5)) {
LAB_005296a0:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
    }
    if ((int)plVar3[0x15] != (pObj->field_6).iTemp) {
      __assert_fail("p->iTarget == pObj->iTemp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                    ,0x195,"void Sfm_ObjSetupSimInfo(Abc_Obj_t *)");
    }
    lVar15 = plVar3[0x29];
    uVar14 = *(ulong *)(lVar15 + (long)iVar5 * 8);
    uVar7 = 0;
    do {
      if ((uVar8 >> (uVar7 & 0x3f) & 1) != 0) {
        bVar17 = (~uVar14 >> (uVar7 & 0x3f) & 1) != 0;
        uVar16 = (ulong)bVar17;
        iVar5 = *(int *)((long)plVar3 + uVar16 * 4 + 0x1d8);
        *(int *)((long)plVar3 + uVar16 * 4 + 0x1d8) = iVar5 + 1;
        local_238[(ulong)bVar17 * 0x40 + (long)iVar5] = (uint)uVar7;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x40);
    plVar3[0x3c] = CONCAT44((int)(plVar3[0x3b] >> 0x26) + 1,((int)plVar3[0x3b] >> 6) + 1);
    lVar4 = plVar3[0x13];
    if (0 < (long)(int)lVar4) {
      uVar14 = 0;
      uVar8 = (ulong)*(uint *)((long)plVar3 + 0x104);
      if ((int)*(uint *)((long)plVar3 + 0x104) < 1) {
        uVar8 = uVar14;
      }
      do {
        if (uVar14 == uVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = *(int *)(plVar3[0x21] + uVar14 * 4);
        if (((long)iVar5 < 0) || (iVar11 <= iVar5)) goto LAB_005296a0;
        uVar7 = *(ulong *)(lVar15 + (long)iVar5 * 8);
        lVar9 = 0;
        bVar17 = true;
        do {
          bVar10 = bVar17;
          uVar16 = (ulong)*(int *)((long)plVar3 + lVar9 * 4 + 0x1d8);
          if (0 < (long)uVar16) {
            uVar13 = 0;
            do {
              if ((uVar7 >> ((ulong)local_238[lVar9 * 0x40 + uVar13] & 0x3f) & 1) != 0) {
                if ((long)*(int *)((long)plVar1 + lVar9 * 0x10 + 4) <= (long)(uVar14 * 8)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
                }
                puVar2 = (ulong *)(plVar1[lVar9 * 2 + 1] + uVar14 * 0x40 +
                                  (uVar13 >> 6 & 0x3ffffff) * 8);
                *puVar2 = *puVar2 | 1L << ((byte)uVar13 & 0x3f);
              }
              uVar13 = uVar13 + 1;
            } while (uVar16 != uVar13);
          }
          lVar9 = 1;
          bVar17 = false;
        } while (bVar10);
        uVar14 = uVar14 + 1;
      } while (uVar14 != (long)(int)lVar4);
    }
  }
  return;
}

Assistant:

static inline void Sfm_ObjSetupSimInfo( Abc_Obj_t * pObj )
{
    Sfm_Dec_t * p = Sfm_DecMan( pObj ); int i;
    p->nPats[0]     = p->nPats[1] = 0;
    p->nPatWords[0] = p->nPatWords[1] = 0;
    Vec_WrdFill( &p->vSets[0], p->nDivs*SFM_SIM_WORDS, 0 );
    Vec_WrdFill( &p->vSets[1], p->nDivs*SFM_SIM_WORDS, 0 );
    // alloc divwords
    p->nDivWords = Abc_Bit6WordNum( 4 * p->nDivs );
    if ( p->nDivWordsAlloc < p->nDivWords )
    {
        p->nDivWordsAlloc = Abc_MaxInt( 16, p->nDivWords );
        for ( i = 0; i < SFM_SUPP_MAX; i++ )
            p->pDivWords[i] = ABC_REALLOC( word, p->pDivWords[i], p->nDivWordsAlloc );
    }
    memset( p->pDivWords[0], 0, sizeof(word) * p->nDivWords );
    // collect simulation info
    if ( p->pPars->fUseSim && p->uCareSet != 0 )
    {
        word uCareSet = p->uCareSet;
        word uValues  = Sfm_DecObjSim(p, pObj);
        int c, d, i, Indexes[2][64];
        assert( p->iTarget == pObj->iTemp );
        assert( p->pPars->fUseSim );
        // find what patterns go to on-set/off-set
        for ( i = 0; i < 64; i++ )
            if ( (uCareSet >> i) & 1 )
            {
                c = !((uValues >> i) & 1);
                Indexes[c][p->nPats[c]++] = i;
            }
        for ( c = 0; c < 2; c++ )
            p->nPatWords[c] = 1 + (p->nPats[c] >> 6);
        // write patterns
        for ( d = 0; d < p->nDivs; d++ )
        {
            word uSim = Vec_WrdEntry( &p->vObjSims, Vec_IntEntry(&p->vObjMap, d) );
            for ( c = 0; c < 2; c++ )
                for ( i = 0; i < p->nPats[c]; i++ )
                    if ( (uSim >> Indexes[c][i]) & 1 )
                        Abc_TtSetBit( Sfm_DecDivPats(p, d, c), i );
        }
        //printf( "Node %d : Onset = %d. Offset = %d.\n", pObj->Id, p->nPats[0], p->nPats[1] );
    }
}